

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.cpp
# Opt level: O3

bool __thiscall miniros::Transport::isHostAllowed(Transport *this,string *host)

{
  pointer pbVar1;
  pointer __s1;
  size_t __n;
  long *plVar2;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  bVar5 = true;
  if (this->only_localhost_allowed_ == true) {
    if (3 < host->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)host);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"127.","");
      plVar2 = local_50;
      if (local_70._M_string_length == local_48) {
        if (local_70._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar3 = bcmp(local_70._M_dataplus._M_p,local_50,local_70._M_string_length);
          bVar5 = iVar3 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (plVar2 != local_40) {
        operator_delete(plVar2,local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        return true;
      }
    }
    pbVar4 = (this->allowed_hosts_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->allowed_hosts_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 != pbVar1) {
      __s1 = (host->_M_dataplus)._M_p;
      __n = host->_M_string_length;
      do {
        if (__n == pbVar4->_M_string_length) {
          if (__n == 0) {
            return true;
          }
          iVar3 = bcmp(__s1,(pbVar4->_M_dataplus)._M_p,__n);
          if (iVar3 == 0) {
            return true;
          }
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (isHostAllowed::loc.initialized_ == false) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"miniros.unknown_package","");
      console::initializeLogLocation(&isHostAllowed::loc,&local_70,Warn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if (isHostAllowed::loc.level_ != Warn) {
      isHostAllowed();
    }
    if (isHostAllowed::loc.logger_enabled_ == true) {
      isHostAllowed();
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Transport::isHostAllowed(const std::string &host) const
{
  if (!only_localhost_allowed_)
    return true; // doesn't matter; we'll connect to anybody

  if (host.length() >= 4 && host.substr(0, 4) == std::string("127."))
    return true; // ipv4 localhost
  // now, loop through the list of valid hostnames and see if we find it
  for (std::vector<std::string>::const_iterator it = allowed_hosts_.begin(); 
       it != allowed_hosts_.end(); ++it)
  {
    if (host == *it)
      return true; // hooray
  }
  MINIROS_WARN("ROS_HOSTNAME / ROS_IP is set to only allow local connections, so "
           "a requested connection to '%s' is being rejected.", host.c_str());
  return false; // sadness
}